

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

size_t __thiscall
linq::IEnumerableCore<linq::IEnumerable<int_&>_>::Count
          (IEnumerableCore<linq::IEnumerable<int_&>_> *this)

{
  bool bVar1;
  int *_;
  undefined1 local_60 [8];
  iterator __end0;
  iterator __begin0;
  IEnumerableCore<linq::IEnumerable<int_&>_> *__range2;
  size_t count;
  IEnumerableCore<linq::IEnumerable<int_&>_> *this_local;
  
  __range2 = (IEnumerableCore<linq::IEnumerable<int_&>_> *)0x0;
  begin((iterator *)&__end0.valid,this);
  end((iterator *)local_60,this);
  while( true ) {
    iterator::iterator((iterator *)&_,(iterator *)local_60);
    bVar1 = iterator::operator!=((iterator *)&__end0.valid,(iterator *)&_);
    iterator::~iterator((iterator *)&_);
    if (!bVar1) break;
    iterator::operator*((iterator *)&__end0.valid);
    __range2 = (IEnumerableCore<linq::IEnumerable<int_&>_> *)
               ((long)&(__range2->source).super_IState<int_&>._vptr_IState + 1);
    iterator::operator++((iterator *)&__end0.valid);
  }
  iterator::~iterator((iterator *)local_60);
  iterator::~iterator((iterator *)&__end0.valid);
  return (size_t)__range2;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}